

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int YUY2ToY(uint8_t *src_yuy2,int src_stride_yuy2,uint8_t *dst_y,int dst_stride_y,int width,
           int height)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_int *YUY2ToYRow;
  int y;
  code *local_38;
  int local_30;
  uint local_28;
  uint local_24;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_38 = YUY2ToYRow_C;
  if ((((in_RDI == 0) || (in_RDX == 0)) || ((int)in_R8D < 1)) || (in_R9D == 0)) {
    local_4 = -1;
  }
  else {
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_R9D < 0) {
      in_R9D = -in_R9D;
      local_10 = in_RDI + (in_R9D + -1) * in_ESI;
      local_14 = -in_ESI;
    }
    local_28 = in_R8D;
    local_24 = in_ECX;
    if ((local_14 == in_R8D * 2) && (in_ECX == in_R8D)) {
      local_28 = in_R9D * in_R8D;
      in_R9D = 1;
      local_24 = 0;
      local_14 = 0;
    }
    iVar1 = libyuv::TestCpuFlag(in_R9D);
    if ((iVar1 != 0) && (local_38 = YUY2ToYRow_Any_SSE2, (local_28 & 0xf) == 0)) {
      local_38 = YUY2ToYRow_SSE2;
    }
    iVar1 = libyuv::TestCpuFlag(in_R9D);
    if ((iVar1 != 0) && (local_38 = YUY2ToYRow_Any_AVX2, (local_28 & 0x1f) == 0)) {
      local_38 = YUY2ToYRow_AVX2;
    }
    local_20 = in_RDX;
    for (local_30 = 0; local_30 < in_R9D; local_30 = local_30 + 1) {
      (*local_38)(local_10,local_20,local_28);
      local_10 = local_10 + local_14;
      local_20 = local_20 + (int)local_24;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int YUY2ToY(const uint8_t* src_yuy2,
            int src_stride_yuy2,
            uint8_t* dst_y,
            int dst_stride_y,
            int width,
            int height) {
  int y;
  void (*YUY2ToYRow)(const uint8_t* src_yuy2, uint8_t* dst_y, int width) =
      YUY2ToYRow_C;
  if (!src_yuy2 || !dst_y || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_yuy2 = src_yuy2 + (height - 1) * src_stride_yuy2;
    src_stride_yuy2 = -src_stride_yuy2;
  }
  // Coalesce rows.
  if (src_stride_yuy2 == width * 2 && dst_stride_y == width) {
    width *= height;
    height = 1;
    src_stride_yuy2 = dst_stride_y = 0;
  }
#if defined(HAS_YUY2TOYROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    YUY2ToYRow = YUY2ToYRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      YUY2ToYRow = YUY2ToYRow_SSE2;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    YUY2ToYRow = YUY2ToYRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      YUY2ToYRow = YUY2ToYRow_AVX2;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    YUY2ToYRow = YUY2ToYRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      YUY2ToYRow = YUY2ToYRow_NEON;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    YUY2ToYRow = YUY2ToYRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      YUY2ToYRow = YUY2ToYRow_MMI;
    }
  }
#endif
#if defined(HAS_YUY2TOYROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    YUY2ToYRow = YUY2ToYRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      YUY2ToYRow = YUY2ToYRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    YUY2ToYRow(src_yuy2, dst_y, width);
    src_yuy2 += src_stride_yuy2;
    dst_y += dst_stride_y;
  }
  return 0;
}